

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

bool __thiscall
CFG::findVariable(CFG *this,string *var,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *productionTo)

{
  Production *this_00;
  bool bVar1;
  reference ppPVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  string *psVar3;
  Production *production;
  iterator __end1;
  iterator __begin1;
  vector<Production_*,_std::allocator<Production_*>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *productionTo_local;
  string *var_local;
  CFG *this_local;
  
  __end1 = std::vector<Production_*,_std::allocator<Production_*>_>::begin(&this->productionsP);
  production = (Production *)
               std::vector<Production_*,_std::allocator<Production_*>_>::end(&this->productionsP);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>
                                *)&production);
    if (!bVar1) {
      return false;
    }
    ppPVar2 = __gnu_cxx::
              __normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppPVar2;
    __x = Production::getToP_abi_cxx11_(this_00);
    bVar1 = std::operator==(__x,productionTo);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>::
    operator++(&__end1);
  }
  psVar3 = Production::getFromP_abi_cxx11_(this_00);
  std::__cxx11::string::operator=((string *)var,(string *)psVar3);
  return true;
}

Assistant:

bool CFG::findVariable(std::string &var, std::vector<std::string> productionTo) {
    for (Production *production: productionsP) {
        if (production->getToP() == productionTo) {
            var = production->getFromP();
            return true;
        }
    }
    return false;
}